

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void * mspace_malloc(mspace msp,size_t bytes)

{
  ulong *puVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  undefined1 (*pauVar4) [16];
  char *oldbase;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined1 (*pauVar13) [16];
  void *pvVar14;
  long lVar15;
  int *piVar16;
  undefined8 *puVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  size_t dvs;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  undefined8 *puVar24;
  undefined1 (*pauVar25) [16];
  byte bVar26;
  undefined8 *puVar27;
  ulong uVar28;
  undefined8 *puVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (bytes < 0xe9) {
    uVar28 = 0x20;
    if (0x16 < bytes) {
      uVar28 = (ulong)((int)bytes + 0x17U & 0x1f0);
    }
    uVar20 = *msp;
    bVar26 = (byte)(uVar28 >> 3);
    uVar21 = uVar20 >> (bVar26 & 0x1f);
    if ((uVar21 & 3) != 0) {
      uVar22 = (uVar21 & 1 | (uint)(uVar28 >> 3)) ^ 1;
      uVar21 = uVar22 << 4;
      uVar10 = (long)msp + (ulong)uVar21 + 0x48;
      lVar15 = *(long *)((long)msp + (ulong)uVar21 + 0x58);
      uVar28 = *(ulong *)(lVar15 + 0x10);
      if (uVar10 == uVar28) {
        *(uint *)msp = uVar20 & ~(1 << (uVar22 & 0x1f));
      }
      else {
        if ((uVar28 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar28 + 0x18) != lVar15))
        goto LAB_001025ea;
        *(ulong *)(uVar28 + 0x18) = uVar10;
        *(ulong *)((long)msp + (ulong)uVar21 + 0x58) = uVar28;
      }
      *(ulong *)(lVar15 + 8) = (ulong)(uVar22 << 3) + 3;
      pbVar2 = (byte *)(lVar15 + 8 + (ulong)(uVar22 << 3));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar15 + 0x10);
    }
    uVar10 = *(ulong *)((long)msp + 8);
    if (uVar10 < uVar28) {
      if (uVar21 != 0) {
        uVar22 = 2 << (bVar26 & 0x1f);
        uVar22 = (-uVar22 | uVar22) & uVar21 << (bVar26 & 0x1f);
        uVar21 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar22 = uVar21 << 4;
        uVar11 = (long)msp + (ulong)uVar22 + 0x48;
        lVar15 = *(long *)((long)msp + (ulong)uVar22 + 0x58);
        uVar18 = *(ulong *)(lVar15 + 0x10);
        if (uVar11 == uVar18) {
          uVar20 = uVar20 & ~(1 << (uVar21 & 0x1f));
          *(uint *)msp = uVar20;
        }
        else {
          if ((uVar18 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar18 + 0x18) != lVar15))
          goto LAB_001025ea;
          *(ulong *)(uVar18 + 0x18) = uVar11;
          *(ulong *)((long)msp + (ulong)uVar22 + 0x58) = uVar18;
        }
        uVar18 = (ulong)(uVar21 << 3);
        uVar11 = uVar18 - uVar28;
        if (uVar11 < 0x20) {
          *(ulong *)(lVar15 + 8) = uVar18 | 3;
          pbVar2 = (byte *)(lVar15 + 8 + uVar18);
          *pbVar2 = *pbVar2 | 1;
          return (void *)(lVar15 + 0x10);
        }
        *(ulong *)(lVar15 + 8) = uVar28 | 3;
        *(ulong *)(lVar15 + 8 + uVar28) = uVar11 | 1;
        *(ulong *)(lVar15 + uVar18) = uVar11;
        if (uVar10 != 0) {
          lVar23 = *(long *)((long)msp + 0x20);
          uVar21 = (uint)(uVar10 >> 3);
          uVar18 = (long)msp + (ulong)(uVar21 * 2) * 8 + 0x48;
          if ((uVar20 >> (uVar21 & 0x1f) & 1) == 0) {
            *(uint *)msp = uVar20 | 1 << ((byte)(uVar10 >> 3) & 0x1f);
            uVar10 = uVar18;
          }
          else {
            uVar10 = *(ulong *)(uVar18 + 0x10);
            if (*(ulong *)(uVar18 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_001025ea;
          }
          *(long *)(uVar18 + 0x10) = lVar23;
          *(long *)(uVar10 + 0x18) = lVar23;
          *(ulong *)(lVar23 + 0x10) = uVar10;
          *(ulong *)(lVar23 + 0x18) = uVar18;
        }
        *(ulong *)((long)msp + 8) = uVar11;
        *(ulong *)((long)msp + 0x20) = lVar15 + uVar28;
        return (void *)(lVar15 + 0x10);
      }
      uVar21 = *(uint *)((long)msp + 4);
      if (uVar21 != 0) {
        uVar22 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        puVar24 = *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600);
        uVar18 = (puVar24[1] & 0xfffffffffffffff8) - uVar28;
        puVar17 = puVar24;
        while ((puVar12 = (undefined8 *)puVar17[4], puVar12 != (undefined8 *)0x0 ||
               (puVar12 = (undefined8 *)puVar17[5], puVar12 != (undefined8 *)0x0))) {
          uVar11 = (puVar12[1] & 0xfffffffffffffff8) - uVar28;
          puVar17 = puVar12;
          if (uVar11 < uVar18) {
            puVar24 = puVar12;
            uVar18 = uVar11;
          }
        }
        puVar17 = *(undefined8 **)((long)msp + 0x18);
        if (puVar24 < puVar17) goto LAB_001025ea;
        puVar12 = (undefined8 *)puVar24[3];
        uVar11 = puVar24[6];
        if (puVar12 == puVar24) {
          if ((undefined8 *)puVar24[5] == (undefined8 *)0x0) {
            if ((undefined8 *)puVar24[4] == (undefined8 *)0x0) {
              puVar12 = (undefined8 *)0x0;
              goto LAB_00102494;
            }
            puVar3 = (undefined8 *)puVar24[4];
            puVar29 = puVar24 + 4;
          }
          else {
            puVar3 = (undefined8 *)puVar24[5];
            puVar29 = puVar24 + 5;
          }
          do {
            do {
              puVar27 = puVar29;
              puVar12 = puVar3;
              puVar3 = (undefined8 *)puVar12[5];
              puVar29 = puVar12 + 5;
            } while ((undefined8 *)puVar12[5] != (undefined8 *)0x0);
            puVar3 = (undefined8 *)puVar12[4];
            puVar29 = puVar12 + 4;
          } while ((undefined8 *)puVar12[4] != (undefined8 *)0x0);
          if (puVar27 < puVar17) goto LAB_001025ea;
          *puVar27 = 0;
        }
        else {
          puVar3 = (undefined8 *)puVar24[2];
          if (((puVar3 < puVar17) || ((undefined8 *)puVar3[3] != puVar24)) ||
             ((undefined8 *)puVar12[2] != puVar24)) goto LAB_001025ea;
          puVar3[3] = puVar12;
          puVar12[2] = puVar3;
        }
LAB_00102494:
        if (uVar11 != 0) {
          uVar22 = *(uint *)(puVar24 + 7);
          if (puVar24 == *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600)) {
            *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600) = puVar12;
            if (puVar12 == (undefined8 *)0x0) {
              *(uint *)((long)msp + 4) = uVar21 & ~(1 << (uVar22 & 0x1f));
            }
            else {
LAB_001024de:
              puVar17 = *(undefined8 **)((long)msp + 0x18);
              if (puVar12 < puVar17) goto LAB_001025ea;
              puVar12[6] = uVar11;
              puVar3 = (undefined8 *)puVar24[4];
              if (puVar3 != (undefined8 *)0x0) {
                if (puVar3 < puVar17) goto LAB_001025ea;
                puVar12[4] = puVar3;
                puVar3[6] = puVar12;
              }
              uVar11 = puVar24[5];
              if (uVar11 != 0) {
                if (uVar11 < *(ulong *)((long)msp + 0x18)) goto LAB_001025ea;
                puVar12[5] = uVar11;
                *(undefined8 **)(uVar11 + 0x30) = puVar12;
              }
            }
          }
          else {
            if (uVar11 < *(ulong *)((long)msp + 0x18)) goto LAB_001025ea;
            *(undefined8 **)
             (uVar11 + 0x20 + (ulong)(*(undefined8 **)(uVar11 + 0x20) != puVar24) * 8) = puVar12;
            if (puVar12 != (undefined8 *)0x0) goto LAB_001024de;
          }
        }
        if (uVar18 < 0x20) {
          puVar24[1] = uVar18 + uVar28 | 3;
          pbVar2 = (byte *)((long)puVar24 + uVar18 + uVar28 + 8);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          puVar24[1] = uVar28 | 3;
          *(ulong *)((long)puVar24 + uVar28 + 8) = uVar18 | 1;
          *(ulong *)((long)puVar24 + uVar28 + uVar18) = uVar18;
          if (uVar10 != 0) {
            lVar15 = *(long *)((long)msp + 0x20);
            uVar21 = (uint)(uVar10 >> 3);
            uVar11 = (long)msp + (ulong)(uVar21 * 2) * 8 + 0x48;
            if ((uVar20 >> (uVar21 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)(uVar10 >> 3) & 0x1f) | uVar20;
              uVar10 = uVar11;
            }
            else {
              uVar10 = *(ulong *)((long)msp + (ulong)(uVar21 * 2) * 8 + 0x58);
              if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_001025ea;
            }
            *(long *)((long)msp + (ulong)(uVar21 * 2) * 8 + 0x58) = lVar15;
            *(long *)(uVar10 + 0x18) = lVar15;
            *(ulong *)(lVar15 + 0x10) = uVar10;
            *(ulong *)(lVar15 + 0x18) = uVar11;
          }
          *(ulong *)((long)msp + 8) = uVar18;
          *(ulong *)((long)msp + 0x20) = (long)puVar24 + uVar28;
        }
        goto LAB_00101c06;
      }
    }
  }
  else {
    uVar28 = 0xffffffffffffffff;
    if (bytes < 0xffffffffffffff80) {
      uVar28 = bytes + 0x17 & 0xfffffffffffffff0;
      uVar20 = *(uint *)((long)msp + 4);
      if (uVar20 != 0) {
        uVar21 = (uint)(bytes + 0x17 >> 8);
        if (uVar21 == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = 0x1f;
          if (uVar21 < 0x10000) {
            uVar22 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar22 == 0; uVar22 = uVar22 - 1) {
              }
            }
            uVar10 = (ulong)((uint)((uVar28 >> ((ulong)(byte)(0x26 - (char)(uVar22 ^ 0x1f)) & 0x3f)
                                    & 1) != 0) + (uVar22 ^ 0x1f) * 2 ^ 0x3e);
          }
        }
        uVar18 = -uVar28;
        puVar24 = *(undefined8 **)((long)msp + uVar10 * 8 + 600);
        if (puVar24 == (undefined8 *)0x0) {
          puVar17 = (undefined8 *)0x0;
          puVar12 = (undefined8 *)0x0;
        }
        else {
          bVar26 = 0x39 - (char)(uVar10 >> 1);
          if ((int)uVar10 == 0x1f) {
            bVar26 = 0;
          }
          lVar15 = uVar28 << (bVar26 & 0x3f);
          puVar17 = (undefined8 *)0x0;
          puVar12 = (undefined8 *)0x0;
          do {
            uVar11 = (puVar24[1] & 0xfffffffffffffff8) - uVar28;
            if ((uVar11 < uVar18) && (puVar12 = puVar24, uVar18 = uVar11, uVar11 == 0)) {
              uVar18 = 0;
              goto LAB_00101a67;
            }
            puVar3 = (undefined8 *)puVar24[5];
            puVar24 = (undefined8 *)puVar24[4 - (lVar15 >> 0x3f)];
            puVar29 = puVar3;
            if (puVar3 == puVar24) {
              puVar29 = puVar17;
            }
            if (puVar3 != (undefined8 *)0x0) {
              puVar17 = puVar29;
            }
            lVar15 = lVar15 * 2;
          } while (puVar24 != (undefined8 *)0x0);
        }
        puVar24 = puVar12;
        if (puVar17 == (undefined8 *)0x0 && puVar12 == (undefined8 *)0x0) {
          uVar21 = 2 << ((byte)uVar10 & 0x1f);
          uVar21 = (-uVar21 | uVar21) & uVar20;
          if (uVar21 == 0) goto LAB_00101afb;
          uVar22 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          puVar17 = *(undefined8 **)((long)msp + (ulong)uVar22 * 8 + 600);
          puVar24 = (undefined8 *)0x0;
        }
        while (puVar12 = puVar17, puVar17 != (undefined8 *)0x0) {
LAB_00101a67:
          uVar11 = (puVar12[1] & 0xfffffffffffffff8) - uVar28;
          uVar10 = uVar11;
          if (uVar18 <= uVar11) {
            uVar10 = uVar18;
          }
          puVar17 = (undefined8 *)puVar12[4];
          if (uVar18 > uVar11) {
            puVar24 = puVar12;
          }
          uVar18 = uVar10;
          if (puVar17 == (undefined8 *)0x0) {
            puVar17 = (undefined8 *)puVar12[5];
          }
        }
        if ((puVar24 != (undefined8 *)0x0) && (uVar18 < *(long *)((long)msp + 8) - uVar28)) {
          puVar17 = *(undefined8 **)((long)msp + 0x18);
          if ((puVar24 < puVar17) || ((long)uVar28 < 1)) goto LAB_001025ea;
          puVar12 = (undefined8 *)puVar24[3];
          uVar10 = puVar24[6];
          if (puVar12 == puVar24) {
            if ((undefined8 *)puVar24[5] == (undefined8 *)0x0) {
              if ((undefined8 *)puVar24[4] == (undefined8 *)0x0) {
                puVar12 = (undefined8 *)0x0;
                goto LAB_00102210;
              }
              puVar3 = (undefined8 *)puVar24[4];
              puVar29 = puVar24 + 4;
            }
            else {
              puVar3 = (undefined8 *)puVar24[5];
              puVar29 = puVar24 + 5;
            }
            do {
              do {
                puVar27 = puVar29;
                puVar12 = puVar3;
                puVar3 = (undefined8 *)puVar12[5];
                puVar29 = puVar12 + 5;
              } while ((undefined8 *)puVar12[5] != (undefined8 *)0x0);
              puVar3 = (undefined8 *)puVar12[4];
              puVar29 = puVar12 + 4;
            } while ((undefined8 *)puVar12[4] != (undefined8 *)0x0);
            if (puVar27 < puVar17) goto LAB_001025ea;
            *puVar27 = 0;
          }
          else {
            puVar3 = (undefined8 *)puVar24[2];
            if (((puVar3 < puVar17) || ((undefined8 *)puVar3[3] != puVar24)) ||
               ((undefined8 *)puVar12[2] != puVar24)) goto LAB_001025ea;
            puVar3[3] = puVar12;
            puVar12[2] = puVar3;
          }
LAB_00102210:
          if (uVar10 != 0) {
            uVar21 = *(uint *)(puVar24 + 7);
            if (puVar24 == *(undefined8 **)((long)msp + (ulong)uVar21 * 8 + 600)) {
              *(undefined8 **)((long)msp + (ulong)uVar21 * 8 + 600) = puVar12;
              if (puVar12 == (undefined8 *)0x0) {
                *(uint *)((long)msp + 4) = uVar20 & ~(1 << (uVar21 & 0x1f));
              }
              else {
LAB_0010224d:
                puVar17 = *(undefined8 **)((long)msp + 0x18);
                if (puVar12 < puVar17) goto LAB_001025ea;
                puVar12[6] = uVar10;
                puVar3 = (undefined8 *)puVar24[4];
                if (puVar3 != (undefined8 *)0x0) {
                  if (puVar3 < puVar17) goto LAB_001025ea;
                  puVar12[4] = puVar3;
                  puVar3[6] = puVar12;
                }
                uVar10 = puVar24[5];
                if (uVar10 != 0) {
                  if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_001025ea;
                  puVar12[5] = uVar10;
                  *(undefined8 **)(uVar10 + 0x30) = puVar12;
                }
              }
            }
            else {
              if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_001025ea;
              *(undefined8 **)
               (uVar10 + 0x20 + (ulong)(*(undefined8 **)(uVar10 + 0x20) != puVar24) * 8) = puVar12;
              if (puVar12 != (undefined8 *)0x0) goto LAB_0010224d;
            }
          }
          if (uVar18 < 0x20) {
            puVar24[1] = uVar18 + uVar28 | 3;
            pbVar2 = (byte *)((long)puVar24 + uVar18 + uVar28 + 8);
            *pbVar2 = *pbVar2 | 1;
          }
          else {
            uVar10 = (long)puVar24 + uVar28;
            puVar24[1] = uVar28 | 3;
            *(ulong *)((long)puVar24 + uVar28 + 8) = uVar18 | 1;
            *(ulong *)(uVar10 + uVar18) = uVar18;
            if (0xff < uVar18) {
              uVar20 = (uint)(uVar18 >> 8);
              if (uVar20 == 0) {
                uVar21 = 0;
              }
              else {
                uVar21 = 0x1f;
                if (uVar20 < 0x10000) {
                  uVar21 = 0x1f;
                  if (uVar20 != 0) {
                    for (; uVar20 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                    }
                  }
                  uVar21 = (uint)((uVar18 >> ((ulong)(byte)(0x26 - (char)(uVar21 ^ 0x1f)) & 0x3f) &
                                  1) != 0) + (uVar21 ^ 0x1f) * 2 ^ 0x3e;
                }
              }
              puVar1 = (ulong *)((long)msp + (ulong)uVar21 * 8 + 600);
              *(uint *)(uVar10 + 0x38) = uVar21;
              *(undefined1 (*) [16])(uVar10 + 0x20) = (undefined1  [16])0x0;
              if ((*(uint *)((long)msp + 4) >> (uVar21 & 0x1f) & 1) == 0) {
                *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar21 & 0x1f);
                *puVar1 = uVar10;
                *(ulong **)(uVar10 + 0x30) = puVar1;
              }
              else {
                bVar26 = 0x39 - (char)(uVar21 >> 1);
                if (uVar21 == 0x1f) {
                  bVar26 = 0;
                }
                lVar15 = uVar18 << (bVar26 & 0x3f);
                uVar28 = *puVar1;
                do {
                  uVar11 = uVar28;
                  if ((*(ulong *)(uVar11 + 8) & 0xfffffffffffffff8) == uVar18) {
                    if ((uVar11 < *(ulong *)((long)msp + 0x18)) ||
                       (uVar28 = *(ulong *)(uVar11 + 0x10), uVar28 < *(ulong *)((long)msp + 0x18)))
                    goto LAB_001025ea;
                    *(ulong *)(uVar28 + 0x18) = uVar10;
                    *(ulong *)(uVar11 + 0x10) = uVar10;
                    *(ulong *)(uVar10 + 0x10) = uVar28;
                    *(ulong *)(uVar10 + 0x18) = uVar11;
                    *(undefined8 *)(uVar10 + 0x30) = 0;
                    goto LAB_00101c06;
                  }
                  lVar23 = lVar15 >> 0x3f;
                  lVar15 = lVar15 * 2;
                  uVar28 = *(ulong *)(uVar11 + 0x20 + lVar23 * -8);
                } while (uVar28 != 0);
                puVar1 = (ulong *)(uVar11 + 0x20 + lVar23 * -8);
                if (puVar1 < *(ulong **)((long)msp + 0x18)) goto LAB_001025ea;
                *puVar1 = uVar10;
                *(ulong *)(uVar10 + 0x30) = uVar11;
              }
              *(ulong *)(uVar10 + 0x18) = uVar10;
              *(ulong *)(uVar10 + 0x10) = uVar10;
              goto LAB_00101c06;
            }
            uVar18 = uVar18 >> 3;
            uVar28 = (long)msp + uVar18 * 0x10 + 0x48;
            if ((*msp >> ((uint)uVar18 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << ((byte)uVar18 & 0x1f);
              uVar11 = uVar28;
            }
            else {
              uVar11 = *(ulong *)((long)msp + uVar18 * 0x10 + 0x58);
              if (uVar11 < *(ulong *)((long)msp + 0x18)) goto LAB_001025ea;
            }
            *(ulong *)((long)msp + uVar18 * 0x10 + 0x58) = uVar10;
            *(ulong *)(uVar11 + 0x18) = uVar10;
            *(ulong *)(uVar10 + 0x10) = uVar11;
            *(ulong *)(uVar10 + 0x18) = uVar28;
          }
          goto LAB_00101c06;
        }
      }
    }
  }
LAB_00101afb:
  uVar10 = *(ulong *)((long)msp + 8);
  uVar18 = uVar10 - uVar28;
  if (uVar28 <= uVar10) {
    puVar24 = *(undefined8 **)((long)msp + 0x20);
    if (uVar18 < 0x20) {
      puVar24[1] = uVar10 | 3;
      pbVar2 = (byte *)((long)puVar24 + uVar10 + 8);
      *pbVar2 = *pbVar2 | 1;
      lVar15 = 0;
      uVar18 = 0;
    }
    else {
      lVar15 = (long)puVar24 + uVar28;
      *(ulong *)((long)puVar24 + uVar28 + 8) = uVar18 | 1;
      *(ulong *)((long)puVar24 + uVar10) = uVar18;
      puVar24[1] = uVar28 | 3;
    }
    *(long *)((long)msp + 0x20) = lVar15;
    *(ulong *)((long)msp + 8) = uVar18;
    goto LAB_00101c06;
  }
  uVar10 = *(ulong *)((long)msp + 0x10) - uVar28;
  if (*(ulong *)((long)msp + 0x10) < uVar28 || uVar10 == 0) {
    if (mparams.magic == 0) {
      init_mparams();
    }
    if ((((*(byte *)((long)msp + 0x370) & 1) != 0) && (mparams.mmap_threshold <= uVar28)) &&
       (*(long *)((long)msp + 0x10) != 0)) {
      uVar10 = -mparams.page_size & uVar28 + mparams.page_size + 0x3e;
      if (*(ulong *)((long)msp + 0x368) == 0) {
        if (uVar28 < uVar10) goto LAB_00101cf2;
      }
      else {
        uVar18 = *(ulong *)((long)msp + 0x358) + uVar10;
        if ((uVar28 < uVar10 && *(ulong *)((long)msp + 0x358) < uVar18) &&
            uVar18 <= *(ulong *)((long)msp + 0x368)) {
LAB_00101cf2:
          pvVar14 = mmap((void *)0x0,uVar10,3,0x22,-1,0);
          if (pvVar14 != (void *)0xffffffffffffffff) {
            uVar28 = (ulong)(-(int)pvVar14 - 0x10U & 0xf);
            puVar24 = (undefined8 *)((long)pvVar14 + uVar28);
            *(ulong *)((long)pvVar14 + uVar28) = uVar28;
            *(ulong *)((long)pvVar14 + uVar28 + 8) = (uVar10 - uVar28) + -0x20;
            *(undefined8 *)((uVar10 - uVar28) + -0x18 + (long)puVar24) = 0xb;
            *(undefined8 *)((long)pvVar14 + (uVar10 - 0x10)) = 0;
            if ((*(void **)((long)msp + 0x18) == (void *)0x0) ||
               (pvVar14 < *(void **)((long)msp + 0x18))) {
              *(void **)((long)msp + 0x18) = pvVar14;
            }
            uVar10 = uVar10 + *(long *)((long)msp + 0x358);
            *(ulong *)((long)msp + 0x358) = uVar10;
            if (*(ulong *)((long)msp + 0x360) < uVar10) {
              *(ulong *)((long)msp + 0x360) = uVar10;
            }
            goto LAB_00101c06;
          }
        }
      }
    }
    uVar10 = -mparams.granularity & uVar28 + mparams.granularity + 0x5f;
    if (uVar10 <= uVar28) {
      return (void *)0x0;
    }
    if ((*(ulong *)((long)msp + 0x368) != 0) &&
       (uVar18 = *(ulong *)((long)msp + 0x358) + uVar10,
       *(ulong *)((long)msp + 0x368) < uVar18 || uVar18 <= *(ulong *)((long)msp + 0x358))) {
      return (void *)0x0;
    }
    pauVar13 = (undefined1 (*) [16])mmap((void *)0x0,uVar10,3,0x22,-1,0);
    if (pauVar13 == (undefined1 (*) [16])0xffffffffffffffff) {
LAB_0010272b:
      piVar16 = __errno_location();
      *piVar16 = 0xc;
      return (void *)0x0;
    }
    uVar18 = *(long *)((long)msp + 0x358) + uVar10;
    *(ulong *)((long)msp + 0x358) = uVar18;
    if (*(ulong *)((long)msp + 0x360) < uVar18) {
      *(ulong *)((long)msp + 0x360) = uVar18;
    }
    pauVar4 = *(undefined1 (**) [16])((long)msp + 0x28);
    if (pauVar4 == (undefined1 (*) [16])0x0) {
      if ((*(undefined1 (**) [16])((long)msp + 0x18) == (undefined1 (*) [16])0x0) ||
         (pauVar13 < *(undefined1 (**) [16])((long)msp + 0x18))) {
        *(undefined1 (**) [16])((long)msp + 0x18) = pauVar13;
      }
      *(undefined1 (**) [16])((long)msp + 0x378) = pauVar13;
      *(ulong *)((long)msp + 0x380) = uVar10;
      *(undefined4 *)((long)msp + 0x390) = 1;
      *(size_t *)((long)msp + 0x40) = mparams.magic;
      *(undefined8 *)((long)msp + 0x38) = 0xfff;
      lVar15 = (long)msp + 0x48;
      lVar23 = 0x20;
      do {
        *(long *)(lVar15 + 0x18) = lVar15;
        *(long *)(lVar15 + 0x10) = lVar15;
        lVar15 = lVar15 + 0x10;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      uVar18 = *(ulong *)((long)msp + -8) & 0xfffffffffffffff8;
      lVar23 = (long)msp + (uVar18 - 0x10);
      uVar11 = (ulong)(-(int)lVar23 - 0x10U & 0xf);
      lVar15 = uVar11 + uVar18;
      uVar18 = (long)pauVar13 + ((uVar10 - lVar23) - uVar11) + -0x50;
      *(long *)((long)msp + 0x28) = (long)msp + lVar15 + -0x10;
      *(ulong *)((long)msp + 0x10) = uVar18;
      *(ulong *)((long)msp + lVar15 + -8) = uVar18 | 1;
      *(undefined8 *)(pauVar13[-5] + uVar10 + 8) = 0x50;
LAB_00101f6a:
      *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
    }
    else {
      puVar24 = (undefined8 *)((long)msp + 0x378);
      puVar17 = puVar24;
      do {
        if (pauVar13 == (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar17 + puVar17[1])) {
          if ((((pauVar4 < pauVar13) && ((undefined1 (*) [16])*puVar17 <= pauVar4)) &&
              ((*(uint *)(puVar17 + 3) & 8) == 0)) && ((*(uint *)(puVar17 + 3) & 1) != 0)) {
            puVar17[1] = puVar17[1] + uVar10;
            lVar15 = uVar10 + *(long *)((long)msp + 0x10);
            uVar10 = (ulong)(-(int)pauVar4 - 0x10U & 0xf);
            uVar18 = lVar15 - uVar10;
            *(undefined1 **)((long)msp + 0x28) = *pauVar4 + uVar10;
            *(ulong *)((long)msp + 0x10) = uVar18;
            *(ulong *)(*pauVar4 + uVar10 + 8) = uVar18 | 1;
            *(undefined8 *)(*pauVar4 + lVar15 + 8) = 0x50;
            goto LAB_00101f6a;
          }
          break;
        }
        puVar17 = (undefined8 *)puVar17[2];
      } while (puVar17 != (undefined8 *)0x0);
      if (pauVar13 < *(undefined1 (**) [16])((long)msp + 0x18)) {
        *(undefined1 (**) [16])((long)msp + 0x18) = pauVar13;
      }
      puVar17 = puVar24;
      do {
        oldbase = (char *)*puVar17;
        puVar12 = puVar24;
        if (oldbase == *pauVar13 + uVar10) {
          if (((*(uint *)(puVar17 + 3) & 8) == 0 & (byte)*(uint *)(puVar17 + 3)) != 0) {
            *puVar17 = pauVar13;
            puVar17[1] = puVar17[1] + uVar10;
            pvVar14 = prepend_alloc((mstate)msp,(char *)pauVar13,oldbase,uVar28);
            return pvVar14;
          }
          break;
        }
        puVar17 = (undefined8 *)puVar17[2];
      } while (puVar17 != (undefined8 *)0x0);
      for (; (pauVar4 < (undefined1 (*) [16])*puVar12 ||
             (pauVar19 = (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar12 + puVar12[1]),
             pauVar19 <= pauVar4)); puVar12 = (undefined8 *)puVar12[2]) {
      }
      pauVar25 = (undefined1 (*) [16])(pauVar19[-6] + (ulong)(0x4fU - (int)pauVar19 & 0xf) + 1);
      if ((undefined1 (*) [16])(pauVar19[-6] + (ulong)(0x4fU - (int)pauVar19 & 0xf) + 1) <
          pauVar4 + 2) {
        pauVar25 = pauVar4;
      }
      uVar11 = (ulong)(-(int)pauVar13 - 0x10U & 0xf);
      uVar18 = (uVar10 - 0x50) - uVar11;
      *(undefined1 **)((long)msp + 0x28) = *pauVar13 + uVar11;
      *(ulong *)((long)msp + 0x10) = uVar18;
      *(ulong *)(*pauVar13 + uVar11 + 8) = uVar18 | 1;
      *(undefined8 *)(pauVar13[-5] + uVar10 + 8) = 0x50;
      *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
      *(undefined8 *)(*pauVar25 + 8) = 0x33;
      uVar5 = *(undefined8 *)((long)msp + 0x380);
      uVar6 = *(undefined8 *)((long)msp + 0x388);
      uVar7 = *(undefined8 *)((long)msp + 0x390);
      *(undefined8 *)pauVar25[1] = *puVar24;
      *(undefined8 *)(pauVar25[1] + 8) = uVar5;
      *(undefined8 *)pauVar25[2] = uVar6;
      *(undefined8 *)(pauVar25[2] + 8) = uVar7;
      *(undefined1 (**) [16])((long)msp + 0x378) = pauVar13;
      *(ulong *)((long)msp + 0x380) = uVar10;
      *(uint *)((long)msp + 0x390) = (uint)(pauVar13 != (undefined1 (*) [16])0xffffffffffffffff);
      *(undefined1 (**) [16])((long)msp + 0x388) = pauVar25 + 1;
      auVar9 = _DAT_00105100;
      auVar8 = _DAT_001050f0;
      pauVar13 = pauVar25 + 4;
      if (pauVar25 + 4 < pauVar19) {
        pauVar13 = pauVar19;
      }
      uVar10 = (long)pauVar13 + (-0x39 - (long)pauVar25);
      auVar32._8_4_ = (int)uVar10;
      auVar32._0_8_ = uVar10;
      auVar32._12_4_ = (int)(uVar10 >> 0x20);
      auVar30._0_8_ = uVar10 >> 3;
      auVar30._8_8_ = auVar32._8_8_ >> 3;
      uVar18 = 0;
      auVar30 = auVar30 ^ _DAT_00105100;
      do {
        auVar31._8_4_ = (int)uVar18;
        auVar31._0_8_ = uVar18;
        auVar31._12_4_ = (int)(uVar18 >> 0x20);
        auVar32 = (auVar31 | auVar8) ^ auVar9;
        if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                    auVar30._4_4_ < auVar32._4_4_) & 1)) {
          *(undefined8 *)(pauVar25[3] + uVar18 * 8 + 8) = 0xb;
        }
        if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
            auVar32._12_4_ <= auVar30._12_4_) {
          *(undefined8 *)(pauVar25[4] + uVar18 * 8) = 0xb;
        }
        uVar18 = uVar18 + 2;
      } while (((uVar10 >> 3) + 2 & 0xfffffffffffffffe) != uVar18);
      uVar10 = (long)pauVar25 - (long)pauVar4;
      if (uVar10 != 0) {
        (*pauVar25)[8] = (*pauVar25)[8] & 0xfe;
        *(ulong *)(*pauVar4 + 8) = uVar10 | 1;
        *(ulong *)*pauVar25 = uVar10;
        if (uVar10 < 0x100) {
          uVar10 = uVar10 >> 3;
          pauVar13 = (undefined1 (*) [16])((long)msp + uVar10 * 0x10 + 0x48);
          if ((*msp >> ((uint)uVar10 & 0x1f) & 1) == 0) {
            *(uint *)msp = *msp | 1 << ((byte)uVar10 & 0x1f);
            pauVar19 = pauVar13;
          }
          else {
            pauVar19 = *(undefined1 (**) [16])((long)msp + uVar10 * 0x10 + 0x58);
            if (pauVar19 < *(undefined1 (**) [16])((long)msp + 0x18)) {
LAB_001025ea:
              abort();
            }
          }
          *(undefined1 (**) [16])((long)msp + uVar10 * 0x10 + 0x58) = pauVar4;
          *(undefined1 (**) [16])(pauVar19[1] + 8) = pauVar4;
          lVar15 = 0x18;
          lVar23 = 0x10;
        }
        else {
          uVar20 = (uint)(uVar10 >> 8);
          if (uVar20 == 0) {
            uVar21 = 0;
          }
          else {
            uVar21 = 0x1f;
            if (uVar20 < 0x10000) {
              uVar21 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                }
              }
              uVar21 = (uint)((uVar10 >> ((ulong)(byte)(0x26 - (char)(uVar21 ^ 0x1f)) & 0x3f) & 1)
                             != 0) + (uVar21 ^ 0x1f) * 2 ^ 0x3e;
            }
          }
          puVar24 = (undefined8 *)((long)msp + (ulong)uVar21 * 8 + 600);
          *(uint *)(pauVar4[3] + 8) = uVar21;
          pauVar4[2] = (undefined1  [16])0x0;
          if ((*(uint *)((long)msp + 4) >> (uVar21 & 0x1f) & 1) == 0) {
            *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar21 & 0x1f);
            *puVar24 = pauVar4;
            *(undefined8 **)pauVar4[3] = puVar24;
          }
          else {
            bVar26 = 0x39 - (char)(uVar21 >> 1);
            if (uVar21 == 0x1f) {
              bVar26 = 0;
            }
            lVar15 = uVar10 << (bVar26 & 0x3f);
            pauVar13 = (undefined1 (*) [16])*puVar24;
            do {
              pauVar19 = pauVar13;
              if ((*(ulong *)(*pauVar19 + 8) & 0xfffffffffffffff8) == uVar10) {
                if ((pauVar19 < *(undefined1 (**) [16])((long)msp + 0x18)) ||
                   (pauVar13 = *(undefined1 (**) [16])pauVar19[1],
                   pauVar13 < *(undefined1 (**) [16])((long)msp + 0x18))) goto LAB_001025ea;
                *(undefined1 (**) [16])(pauVar13[1] + 8) = pauVar4;
                *(undefined1 (**) [16])pauVar19[1] = pauVar4;
                *(undefined1 (**) [16])pauVar4[1] = pauVar13;
                lVar15 = 0x30;
                lVar23 = 0x18;
                pauVar13 = (undefined1 (*) [16])0x0;
                goto LAB_00102716;
              }
              lVar23 = lVar15 >> 0x3f;
              lVar15 = lVar15 * 2;
              pauVar13 = *(undefined1 (**) [16])((long)pauVar19 + lVar23 * -8 + 0x20);
            } while (pauVar13 != (undefined1 (*) [16])0x0);
            puVar24 = (undefined8 *)((long)pauVar19 + lVar23 * -8 + 0x20);
            if (puVar24 < *(undefined8 **)((long)msp + 0x18)) goto LAB_001025ea;
            *puVar24 = pauVar4;
            *(undefined1 (**) [16])pauVar4[3] = pauVar19;
          }
          lVar15 = 0x10;
          lVar23 = 0x18;
          pauVar19 = pauVar4;
          pauVar13 = pauVar4;
        }
LAB_00102716:
        *(undefined1 (**) [16])(*pauVar4 + lVar23) = pauVar19;
        *(undefined1 (**) [16])(*pauVar4 + lVar15) = pauVar13;
      }
    }
    uVar10 = *(ulong *)((long)msp + 0x10) - uVar28;
    if (*(ulong *)((long)msp + 0x10) < uVar28 || uVar10 == 0) goto LAB_0010272b;
  }
  *(ulong *)((long)msp + 0x10) = uVar10;
  puVar24 = *(undefined8 **)((long)msp + 0x28);
  *(ulong *)((long)msp + 0x28) = (long)puVar24 + uVar28;
  *(ulong *)((long)puVar24 + uVar28 + 8) = uVar10 | 1;
  puVar24[1] = uVar28 | 3;
LAB_00101c06:
  return puVar24 + 2;
}

Assistant:

void* mspace_malloc(mspace msp, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (!PREACTION(ms)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = ms->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(ms, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(ms, b, p, idx);
        set_inuse_and_pinuse(ms, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }

      else if (nb > ms->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(ms, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(ms, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(ms, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(ms, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }

        else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }
    }

    if (nb <= ms->dvsize) {
      size_t rsize = ms->dvsize - nb;
      mchunkptr p = ms->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
        ms->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = ms->dvsize;
        ms->dvsize = 0;
        ms->dv = 0;
        set_inuse_and_pinuse(ms, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    else if (nb < ms->topsize) { /* Split top */
      size_t rsize = ms->topsize -= nb;
      mchunkptr p = ms->top;
      mchunkptr r = ms->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(ms, ms->top);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(ms, nb);

  postaction:
    POSTACTION(ms);
    return mem;
  }

  return 0;
}